

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

uint32_t av1_write_sequence_header_obu(SequenceHeader *seq_params,uint8_t *dst,size_t dst_size)

{
  uint32_t uVar1;
  long in_RDI;
  int i;
  uint32_t size;
  aom_write_bit_buffer wb;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int in_stack_ffffffffffffffd0;
  undefined4 uVar2;
  aom_write_bit_buffer local_28 [2];
  long local_8;
  
  local_28[0].bit_offset = 0;
  uVar2 = 0;
  local_8 = in_RDI;
  write_profile('\0',(aom_write_bit_buffer *)
                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  aom_wb_write_bit(local_28,(uint)*(byte *)(local_8 + 0x39));
  aom_wb_write_bit(local_28,(uint)*(byte *)(local_8 + 0x3a));
  if (*(char *)(local_8 + 0x3a) == '\0') {
    aom_wb_write_bit(local_28,*(int *)(local_8 + 0xf8));
    if (*(int *)(local_8 + 0xf8) != 0) {
      write_timing_info_header
                ((aom_timing_info_t *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                 (aom_write_bit_buffer *)
                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      aom_wb_write_bit(local_28,(uint)*(byte *)(local_8 + 0x10c));
      if (*(char *)(local_8 + 0x10c) != '\0') {
        write_decoder_model_info
                  ((aom_dec_model_info_t *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                   (aom_write_bit_buffer *)
                   CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      }
    }
    aom_wb_write_bit(local_28,(uint)*(byte *)(local_8 + 0x120));
    aom_wb_write_literal
              ((aom_write_bit_buffer *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
    for (in_stack_ffffffffffffffd0 = 0; in_stack_ffffffffffffffd0 < *(int *)(local_8 + 0x70) + 1;
        in_stack_ffffffffffffffd0 = in_stack_ffffffffffffffd0 + 1) {
      aom_wb_write_literal
                ((aom_write_bit_buffer *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                 in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      write_bitstream_level
                ((AV1_LEVEL)((uint)uVar2 >> 0x18),
                 (aom_write_bit_buffer *)
                 CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
      if (7 < *(byte *)(local_8 + 0x121 + (long)in_stack_ffffffffffffffd0)) {
        aom_wb_write_bit(local_28,(uint)*(byte *)(local_8 + 0x141 + (long)in_stack_ffffffffffffffd0)
                        );
      }
      if ((*(char *)(local_8 + 0x10c) != '\0') &&
         (aom_wb_write_bit(local_28,*(int *)(local_8 + 0x168 +
                                            (long)in_stack_ffffffffffffffd0 * 0x30)),
         *(int *)(local_8 + 0x168 + (long)in_stack_ffffffffffffffd0 * 0x30) != 0)) {
        write_dec_model_op_parameters
                  ((aom_dec_model_op_parameters_t *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc,(aom_write_bit_buffer *)0x124f363);
      }
      if ((*(char *)(local_8 + 0x120) != '\0') &&
         (aom_wb_write_bit(local_28,*(int *)(local_8 + (long)in_stack_ffffffffffffffd0 * 0x30 +
                                            0x18c)),
         *(int *)(local_8 + (long)in_stack_ffffffffffffffd0 * 0x30 + 0x18c) != 0)) {
        aom_wb_write_literal
                  ((aom_write_bit_buffer *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                   in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
      }
    }
  }
  else {
    write_bitstream_level
              ((AV1_LEVEL)((uint)uVar2 >> 0x18),
               (aom_write_bit_buffer *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8)
              );
  }
  write_sequence_header
            ((SequenceHeader *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
             (aom_write_bit_buffer *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  write_color_config((SequenceHeader *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),
                     (aom_write_bit_buffer *)
                     CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  aom_wb_write_bit(local_28,(uint)*(byte *)(local_8 + 0x6d));
  add_trailing_bits((aom_write_bit_buffer *)0x124f431);
  uVar1 = aom_wb_bytes_written(local_28);
  return uVar1;
}

Assistant:

uint32_t av1_write_sequence_header_obu(const SequenceHeader *seq_params,
                                       uint8_t *const dst, size_t dst_size) {
  // TODO: bug 42302568 - Use dst_size.
  (void)dst_size;
  struct aom_write_bit_buffer wb = { dst, 0 };
  uint32_t size = 0;

  write_profile(seq_params->profile, &wb);

  // Still picture or not
  aom_wb_write_bit(&wb, seq_params->still_picture);
  assert(IMPLIES(!seq_params->still_picture,
                 !seq_params->reduced_still_picture_hdr));
  // whether to use reduced still picture header
  aom_wb_write_bit(&wb, seq_params->reduced_still_picture_hdr);

  if (seq_params->reduced_still_picture_hdr) {
    assert(seq_params->timing_info_present == 0);
    assert(seq_params->decoder_model_info_present_flag == 0);
    assert(seq_params->display_model_info_present_flag == 0);
    write_bitstream_level(seq_params->seq_level_idx[0], &wb);
  } else {
    aom_wb_write_bit(
        &wb, seq_params->timing_info_present);  // timing info present flag

    if (seq_params->timing_info_present) {
      // timing_info
      write_timing_info_header(&seq_params->timing_info, &wb);
      aom_wb_write_bit(&wb, seq_params->decoder_model_info_present_flag);
      if (seq_params->decoder_model_info_present_flag) {
        write_decoder_model_info(&seq_params->decoder_model_info, &wb);
      }
    }
    aom_wb_write_bit(&wb, seq_params->display_model_info_present_flag);
    aom_wb_write_literal(&wb, seq_params->operating_points_cnt_minus_1,
                         OP_POINTS_CNT_MINUS_1_BITS);
    int i;
    for (i = 0; i < seq_params->operating_points_cnt_minus_1 + 1; i++) {
      aom_wb_write_literal(&wb, seq_params->operating_point_idc[i],
                           OP_POINTS_IDC_BITS);
      write_bitstream_level(seq_params->seq_level_idx[i], &wb);
      if (seq_params->seq_level_idx[i] >= SEQ_LEVEL_4_0)
        aom_wb_write_bit(&wb, seq_params->tier[i]);
      if (seq_params->decoder_model_info_present_flag) {
        aom_wb_write_bit(
            &wb, seq_params->op_params[i].decoder_model_param_present_flag);
        if (seq_params->op_params[i].decoder_model_param_present_flag) {
          write_dec_model_op_parameters(
              &seq_params->op_params[i],
              seq_params->decoder_model_info
                  .encoder_decoder_buffer_delay_length,
              &wb);
        }
      }
      if (seq_params->display_model_info_present_flag) {
        aom_wb_write_bit(
            &wb, seq_params->op_params[i].display_model_param_present_flag);
        if (seq_params->op_params[i].display_model_param_present_flag) {
          assert(seq_params->op_params[i].initial_display_delay >= 1);
          assert(seq_params->op_params[i].initial_display_delay <= 10);
          aom_wb_write_literal(
              &wb, seq_params->op_params[i].initial_display_delay - 1, 4);
        }
      }
    }
  }
  write_sequence_header(seq_params, &wb);

  write_color_config(seq_params, &wb);

  aom_wb_write_bit(&wb, seq_params->film_grain_params_present);

  add_trailing_bits(&wb);

  size = aom_wb_bytes_written(&wb);
  return size;
}